

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::
CustomLayerParams_CustomLayerParamValue
          (CustomLayerParams_CustomLayerParamValue *this,
          CustomLayerParams_CustomLayerParamValue *from)

{
  bool bVar1;
  uint32 uVar2;
  int32 iVar3;
  void *pvVar4;
  ValueUnion VVar5;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__CustomLayerParams_CustomLayerParamValue_003bd2f8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar4 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar4 & 0xfffffffffffffffe));
  }
  this->_oneof_case_[0] = 0;
  uVar2 = from->_oneof_case_[0];
  if ((int)uVar2 < 0x1e) {
    if (uVar2 == 10) {
      VVar5 = from->value_;
      clear_value(this);
      this->_oneof_case_[0] = 10;
      this->value_ = VVar5;
    }
    else if (uVar2 == 0x14) {
      VVar5 = from->value_;
      clear_value(this);
      this->_oneof_case_[0] = 0x14;
      (this->value_).doublevalue_ =
           (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&(this->value_).stringvalue_,(string *)VVar5);
    }
  }
  else if (uVar2 == 0x1e) {
    iVar3 = (from->value_).intvalue_;
    clear_value(this);
    this->_oneof_case_[0] = 0x1e;
    (this->value_).intvalue_ = iVar3;
  }
  else if (uVar2 == 0x28) {
    VVar5 = from->value_;
    clear_value(this);
    this->_oneof_case_[0] = 0x28;
    this->value_ = VVar5;
  }
  else if (uVar2 == 0x32) {
    bVar1 = (from->value_).boolvalue_;
    clear_value(this);
    this->_oneof_case_[0] = 0x32;
    (this->value_).boolvalue_ = bVar1;
  }
  return;
}

Assistant:

CustomLayerParams_CustomLayerParamValue::CustomLayerParams_CustomLayerParamValue(const CustomLayerParams_CustomLayerParamValue& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_value();
  switch (from.value_case()) {
    case kDoubleValue: {
      set_doublevalue(from.doublevalue());
      break;
    }
    case kStringValue: {
      set_stringvalue(from.stringvalue());
      break;
    }
    case kIntValue: {
      set_intvalue(from.intvalue());
      break;
    }
    case kLongValue: {
      set_longvalue(from.longvalue());
      break;
    }
    case kBoolValue: {
      set_boolvalue(from.boolvalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
}